

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

uint32_t random32(void)

{
  int iVar1;
  result_type rVar2;
  result_type_conflict rVar3;
  
  if (random32()::dev == '\0') {
    iVar1 = __cxa_guard_acquire(&random32()::dev);
    if (iVar1 != 0) {
      std::random_device::random_device(&random32::dev);
      __cxa_atexit(std::random_device::~random_device,&random32::dev,&__dso_handle);
      __cxa_guard_release(&random32()::dev);
    }
  }
  if (random32()::raand == '\0') {
    iVar1 = __cxa_guard_acquire(&random32()::raand);
    if (iVar1 != 0) {
      rVar2 = std::random_device::operator()(&random32::dev);
      std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
      linear_congruential_engine(&random32::raand,(ulong)rVar2);
      __cxa_guard_release(&random32()::raand);
    }
  }
  rVar3 = std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::operator()
                    (&random32::raand);
  return (uint32_t)rVar3;
}

Assistant:

uint32_t random32()
{
    static std::random_device dev;
    static std::minstd_rand raand(dev());
    return raand();
}